

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_xml.h
# Opt level: O2

bool __thiscall Kumu::AttributeVisitor::Element(AttributeVisitor *this,XMLElement *e)

{
  __type _Var1;
  XMLElement *pXVar2;
  
  pXVar2 = e;
  while (pXVar2 = *(XMLElement **)pXVar2, pXVar2 != e) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (pXVar2 + 0x10),&this->attr_name);
    if (_Var1) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->value_list,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (pXVar2 + 0x30));
    }
  }
  return true;
}

Assistant:

bool Element(const XMLElement& e)
    {
      const AttributeList& l = e.GetAttributes();
      AttributeList::const_iterator i;
 
      for ( i = l.begin(); i != l.end(); ++i )
	{
	  if ( i->name == attr_name )
	    {
	      value_list.insert(i->value);
	    }
	}

      return true;
    }